

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCnf.c
# Opt level: O3

void Ssw_AddClausesMux(Ssw_Sat_t *p,Aig_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int Fill;
  int Fill_00;
  int Fill_01;
  int Fill_02;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int pLits [4];
  Aig_Obj_t *pNodeE;
  Aig_Obj_t *pNodeT;
  uint local_88;
  uint local_84;
  uint local_80;
  lit local_7c [3];
  uint local_70;
  uint local_6c;
  uint local_68;
  undefined4 uStack_64;
  Aig_Obj_t *local_60;
  Aig_Obj_t *local_58;
  Aig_Obj_t *local_50;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Aig_IsComplement( pNode )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswCnf.c"
                  ,0x6d,"void Ssw_AddClausesMux(Ssw_Sat_t *, Aig_Obj_t *)");
  }
  iVar6 = Aig_ObjIsMuxType(pNode);
  if (iVar6 == 0) {
    __assert_fail("Aig_ObjIsMuxType( pNode )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswCnf.c"
                  ,0x6e,"void Ssw_AddClausesMux(Ssw_Sat_t *, Aig_Obj_t *)");
  }
  local_58 = Aig_ObjRecognizeMux(pNode,&local_50,(Aig_Obj_t **)&local_68);
  pVVar3 = p->vSatVars;
  iVar6 = pNode->Id;
  Vec_IntFillExtra(pVVar3,iVar6 + 1,Fill);
  if ((-1 < (long)iVar6) && (iVar6 < pVVar3->nSize)) {
    iVar6 = pVVar3->pArray[iVar6];
    pVVar3 = p->vSatVars;
    iVar1 = local_58->Id;
    Vec_IntFillExtra(pVVar3,iVar1 + 1,Fill_00);
    if ((-1 < (long)iVar1) && (iVar1 < pVVar3->nSize)) {
      iVar1 = pVVar3->pArray[iVar1];
      pVVar3 = p->vSatVars;
      iVar2 = *(int *)(((ulong)local_50 & 0xfffffffffffffffe) + 0x24);
      Vec_IntFillExtra(pVVar3,iVar2 + 1,Fill_01);
      if ((-1 < (long)iVar2) && (iVar2 < pVVar3->nSize)) {
        local_38 = (ulong)(uint)pVVar3->pArray[iVar2];
        pVVar3 = p->vSatVars;
        iVar2 = *(int *)((CONCAT44(uStack_64,local_68) & 0xfffffffffffffffe) + 0x24);
        Vec_IntFillExtra(pVVar3,iVar2 + 1,Fill_02);
        uVar9 = local_68;
        if ((-1 < (long)iVar2) && (iVar2 < pVVar3->nSize)) {
          local_40 = (ulong)(uint)pVVar3->pArray[iVar2];
          uVar4 = iVar1 * 2;
          local_6c = iVar1 * 2 + 1;
          uVar8 = ((uint)local_50 & 1) + (int)local_38 * 2;
          local_70 = uVar8 ^ 1;
          uVar5 = iVar6 * 2;
          local_88 = local_6c;
          local_84 = local_70;
          local_80 = uVar5;
          if (p->fPolarFlip != 0) {
            if ((local_58->field_0x18 & 8) != 0) {
              local_88 = uVar4;
            }
            if ((*(byte *)(((ulong)local_50 & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
              local_84 = uVar8;
            }
            if ((pNode->field_0x18 & 8) != 0) {
              local_80 = uVar5 | 1;
            }
          }
          local_60 = pNode;
          iVar6 = sat_solver_addclause(p->pSat,(lit *)&local_88,local_7c);
          if (iVar6 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswCnf.c"
                          ,0x8c,"void Ssw_AddClausesMux(Ssw_Sat_t *, Aig_Obj_t *)");
          }
          local_88 = local_6c;
          uVar7 = uVar5 | 1;
          local_84 = uVar8;
          local_80 = uVar7;
          if (p->fPolarFlip != 0) {
            if ((local_58->field_0x18 & 8) != 0) {
              local_88 = uVar4;
            }
            if ((*(byte *)(((ulong)local_50 & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
              local_84 = local_70;
            }
            if ((local_60->field_0x18 & 8) != 0) {
              local_80 = uVar5;
            }
          }
          local_44 = uVar8;
          iVar6 = sat_solver_addclause(p->pSat,(lit *)&local_88,local_7c);
          if (iVar6 != 0) {
            uVar8 = (uVar9 & 1) + (int)local_40 * 2;
            uVar9 = uVar8 ^ 1;
            local_88 = uVar4;
            local_84 = uVar9;
            local_80 = uVar5;
            if (p->fPolarFlip != 0) {
              if ((local_58->field_0x18 & 8) != 0) {
                local_88 = local_6c;
              }
              if ((*(byte *)((CONCAT44(uStack_64,local_68) & 0xfffffffffffffffe) + 0x18) & 8) != 0)
              {
                local_84 = uVar8;
              }
              if ((local_60->field_0x18 & 8) != 0) {
                local_80 = uVar7;
              }
            }
            iVar6 = sat_solver_addclause(p->pSat,(lit *)&local_88,local_7c);
            if (iVar6 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswCnf.c"
                            ,0xa2,"void Ssw_AddClausesMux(Ssw_Sat_t *, Aig_Obj_t *)");
            }
            local_88 = uVar4;
            local_84 = uVar8;
            local_80 = uVar7;
            if (p->fPolarFlip != 0) {
              if ((local_58->field_0x18 & 8) != 0) {
                local_88 = local_6c;
              }
              if ((*(byte *)((CONCAT44(uStack_64,local_68) & 0xfffffffffffffffe) + 0x18) & 8) != 0)
              {
                local_84 = uVar9;
              }
              if ((local_60->field_0x18 & 8) != 0) {
                local_80 = uVar5;
              }
            }
            iVar6 = sat_solver_addclause(p->pSat,(lit *)&local_88,local_7c);
            if (iVar6 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswCnf.c"
                            ,0xad,"void Ssw_AddClausesMux(Ssw_Sat_t *, Aig_Obj_t *)");
            }
            if ((int)local_38 != (int)local_40) {
              local_88 = local_44;
              local_84 = uVar8;
              local_80 = uVar7;
              if (p->fPolarFlip != 0) {
                if ((*(byte *)(((ulong)local_50 & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
                  local_88 = local_70;
                }
                if ((*(byte *)((CONCAT44(uStack_64,local_68) & 0xfffffffffffffffe) + 0x18) & 8) != 0
                   ) {
                  local_84 = uVar9;
                }
                if ((local_60->field_0x18 & 8) != 0) {
                  local_80 = uVar5;
                }
              }
              iVar6 = sat_solver_addclause(p->pSat,(lit *)&local_88,local_7c);
              if (iVar6 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswCnf.c"
                              ,0xc6,"void Ssw_AddClausesMux(Ssw_Sat_t *, Aig_Obj_t *)");
              }
              local_88 = local_70;
              local_84 = uVar9;
              local_80 = uVar5;
              if (p->fPolarFlip != 0) {
                if ((*(byte *)(((ulong)local_50 & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
                  local_88 = local_44;
                }
                if ((*(byte *)((CONCAT44(uStack_64,local_68) & 0xfffffffffffffffe) + 0x18) & 8) != 0
                   ) {
                  local_84 = uVar8;
                }
                if ((local_60->field_0x18 & 8) != 0) {
                  local_80 = uVar7;
                }
              }
              iVar6 = sat_solver_addclause(p->pSat,(lit *)&local_88,local_7c);
              if (iVar6 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswCnf.c"
                              ,0xd1,"void Ssw_AddClausesMux(Ssw_Sat_t *, Aig_Obj_t *)");
              }
            }
            return;
          }
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswCnf.c"
                        ,0x97,"void Ssw_AddClausesMux(Ssw_Sat_t *, Aig_Obj_t *)");
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Ssw_AddClausesMux( Ssw_Sat_t * p, Aig_Obj_t * pNode )
{
    Aig_Obj_t * pNodeI, * pNodeT, * pNodeE;
    int pLits[4], RetValue, VarF, VarI, VarT, VarE, fCompT, fCompE;

    assert( !Aig_IsComplement( pNode ) );
    assert( Aig_ObjIsMuxType( pNode ) );
    // get nodes (I = if, T = then, E = else)
    pNodeI = Aig_ObjRecognizeMux( pNode, &pNodeT, &pNodeE );
    // get the variable numbers
    VarF = Ssw_ObjSatNum(p,pNode);
    VarI = Ssw_ObjSatNum(p,pNodeI);
    VarT = Ssw_ObjSatNum(p,Aig_Regular(pNodeT));
    VarE = Ssw_ObjSatNum(p,Aig_Regular(pNodeE));
    // get the complementation flags
    fCompT = Aig_IsComplement(pNodeT);
    fCompE = Aig_IsComplement(pNodeE);

    // f = ITE(i, t, e)

    // i' + t' + f
    // i' + t  + f'
    // i  + e' + f
    // i  + e  + f'

    // create four clauses
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 1^fCompT);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeT)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 0^fCompT);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeT)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );

    // two additional clauses
    // t' & e' -> f'
    // t  & e  -> f

    // t  + e   + f'
    // t' + e'  + f

    if ( VarT == VarE )
    {
//        assert( fCompT == !fCompE );
        return;
    }

    pLits[0] = toLitCond(VarT, 0^fCompT);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->fPolarFlip )
    {
        if ( Aig_Regular(pNodeT)->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarT, 1^fCompT);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->fPolarFlip )
    {
        if ( Aig_Regular(pNodeT)->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
}